

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O3

void __thiscall curlpp::FormParts::File::~File(File *this)

{
  ~File(this);
  operator_delete(this);
  return;
}

Assistant:

curlpp::FormParts::File::~File()
{}